

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxmerge.cpp
# Opt level: O1

bool save_vox_scene(char *pcFilename,ogt_vox_scene *scene)

{
  uint8_t *__ptr;
  FILE *__s;
  bool bVar1;
  uint32_t buffersize;
  uint32_t local_1c;
  
  local_1c = 0;
  __ptr = ogt_vox_write_scene(scene,&local_1c);
  if (__ptr == (uint8_t *)0x0) {
    bVar1 = false;
  }
  else {
    __s = fopen(pcFilename,"wb");
    bVar1 = __s != (FILE *)0x0;
    if (bVar1) {
      fwrite(__ptr,(ulong)local_1c,1,__s);
      fclose(__s);
    }
    (*g_free_func)(__ptr);
  }
  return bVar1;
}

Assistant:

bool save_vox_scene(const char* pcFilename, const ogt_vox_scene* scene)
{
    // save the scene back out.
    uint32_t buffersize = 0;
    uint8_t* buffer = ogt_vox_write_scene(scene, &buffersize);
    if (!buffer) {
        return false;
    }

    // open the file for write
    FILE * fp = open_file(pcFilename, "wb");
    if (!fp) {
        ogt_vox_free(buffer);
        return false;
    }

    fwrite(buffer, buffersize, 1, fp);
    fclose(fp);
    ogt_vox_free(buffer);
    return true;
}